

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          bool is_writer)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  pcVar3 = FieldDescriptor::type_name((FieldDescriptor *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&bStack_38);
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  cVar1 = *pcVar3;
  if ((byte)(cVar1 + 0x9fU) < 0x1a) {
    *pcVar3 = cVar1 + -0x20;
  }
  bVar2 = FieldDescriptor::is_packed((FieldDescriptor *)this);
  if (bVar2) {
    std::operator+(&bStack_38,"Packed",__return_storage_ptr__);
  }
  else {
    if ((char)field == '\0') {
      return __return_storage_ptr__;
    }
    if (*(int *)(this + 0x4c) != 3) {
      return __return_storage_ptr__;
    }
    std::operator+(&bStack_38,"Repeated",__return_storage_ptr__);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

string JSBinaryReadWriteMethodName(const FieldDescriptor* field,
                                   bool is_writer) {
  string name = JSBinaryReaderMethodType(field);
  if (field->is_packed()) {
    name = "Packed" + name;
  } else if (is_writer && field->is_repeated()) {
    name = "Repeated" + name;
  }
  return name;
}